

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

PolyNode * __thiscall ClipperLib::PolyNode::GetNextSiblingUp(PolyNode *this)

{
  uint *puVar1;
  PolyNode *pPVar2;
  pointer ppPVar3;
  
  do {
    pPVar2 = this->Parent;
    if (pPVar2 == (PolyNode *)0x0) {
      return (PolyNode *)0x0;
    }
    puVar1 = &this->Index;
    ppPVar3 = (pPVar2->Childs).
              super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    this = pPVar2;
  } while (((long)(pPVar2->Childs).
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3) - 1U ==
           (ulong)*puVar1);
  return ppPVar3[*puVar1 + 1];
}

Assistant:

PolyNode* PolyNode::GetNextSiblingUp() const
{ 
  if (!Parent) //protects against PolyTree.GetNextSiblingUp()
      return 0;
  else if (Index == Parent->Childs.size() - 1)
      return Parent->GetNextSiblingUp();
  else
      return Parent->Childs[Index + 1];
}